

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.c
# Opt level: O1

bool_t UpperPath(tchar_t *Path,tchar_t *Last,size_t LastLen)

{
  int iVar1;
  tchar_t *__s;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  bool_t HasHost;
  tchar_t Mime [32];
  long local_60;
  tchar_t local_58 [40];
  
  if (*Path == '\0') {
    return 0;
  }
  RemovePathDelimiter(Path);
  __s = GetProtocol(Path,local_58,0x20,&local_60);
  pcVar2 = strrchr(__s,0x5c);
  pcVar3 = strrchr(__s,0x2f);
  pcVar4 = pcVar2;
  if (pcVar2 < pcVar3) {
    pcVar4 = pcVar3;
  }
  if (pcVar2 == (char *)0x0) {
    pcVar4 = pcVar3;
  }
  if (pcVar4 == (char *)0x0) {
    iVar1 = tcsicmp(local_58,"smb");
    if (iVar1 == 0) {
      *__s = '\0';
      tcscpy_s(Last,LastLen,Path);
      return 1;
    }
    if ((local_60 != 0) && (iVar1 = tcsicmp(local_58,"upnp"), iVar1 != 0)) {
      return 0;
    }
    pcVar4 = __s;
    if (*__s == '\0') {
      __s = Path;
      pcVar4 = Path;
    }
  }
  else {
    pcVar4 = pcVar4 + 1;
  }
  if (Last != (tchar_t *)0x0) {
    tcscpy_s(Last,LastLen,pcVar4);
  }
  if (pcVar4 == __s) {
    *pcVar4 = '\0';
  }
  while ((pcVar4 = pcVar4 + -1, __s <= pcVar4 && ((*pcVar4 == '\\' || (*pcVar4 == '/'))))) {
    *pcVar4 = '\0';
  }
  return 1;
}

Assistant:

bool_t UpperPath(tchar_t* Path, tchar_t* Last, size_t LastLen)
{
    tchar_t *a,*b,*c;
    bool_t HasHost;
    tchar_t Mime[32];

    if (!*Path)
        return 0;

    RemovePathDelimiter(Path);
    c = (tchar_t*)GetProtocol(Path,Mime,TSIZEOF(Mime),&HasHost);

    a = tcsrchr(c,'\\');
    b = tcsrchr(c,'/');
    if (!a || (b && b>a))
        a=b;

    if (!a)
    {
        if (tcsicmp(Mime, T("smb")) == 0) {
            *c = 0;
            tcscpy_s(Last, LastLen, Path);
            return 1;
        }

        if (HasHost && tcsicmp(Mime, T("upnp"))!=0)
            return 0;
        a=c;
        if (!a[0]) // only mime left
            a=c=Path;
    }
    else
        ++a;

    if (Last)
        tcscpy_s(Last,LastLen,a);

    if (a==c)
        *a = 0;

    while (--a>=c && (*a=='\\' || *a=='/'))
        *a = 0;

    return 1;
}